

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::grisu_count_digits(uint32_t n)

{
  uint32_t n_local;
  undefined4 local_4;
  
  if (n < 10) {
    local_4 = 1;
  }
  else if (n < 100) {
    local_4 = 2;
  }
  else if (n < 1000) {
    local_4 = 3;
  }
  else if (n < 10000) {
    local_4 = 4;
  }
  else if (n < 100000) {
    local_4 = 5;
  }
  else if (n < 1000000) {
    local_4 = 6;
  }
  else if (n < 10000000) {
    local_4 = 7;
  }
  else if (n < 100000000) {
    local_4 = 8;
  }
  else if (n < 1000000000) {
    local_4 = 9;
  }
  else {
    local_4 = 10;
  }
  return local_4;
}

Assistant:

inline int grisu_count_digits(uint32_t n) {
  if (n < 10) return 1;
  if (n < 100) return 2;
  if (n < 1000) return 3;
  if (n < 10000) return 4;
  if (n < 100000) return 5;
  if (n < 1000000) return 6;
  if (n < 10000000) return 7;
  if (n < 100000000) return 8;
  if (n < 1000000000) return 9;
  return 10;
}